

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

int __thiscall QAbstractSpinBoxPrivate::init(QAbstractSpinBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QLatin1StringView str;
  int iVar2;
  QWidget *this_00;
  QAbstractSpinBoxPrivate *dp;
  QSpinBoxValidator *this_01;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QAbstractSpinBox *q;
  QStyleOptionSpinBox opt;
  undefined4 in_stack_ffffffffffffff08;
  FocusPolicy in_stack_ffffffffffffff0c;
  QLineEdit *in_stack_ffffffffffffff20;
  QWidget *this_02;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff2c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  QWidget *pQVar5;
  QAbstractSpinBoxPrivate *this_03;
  QLineEdit *in_stack_ffffffffffffff98;
  QAbstractSpinBox *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = this;
  this_00 = &q_func(this)->super_QWidget;
  pQVar5 = this_00;
  dp = (QAbstractSpinBoxPrivate *)operator_new(0x28);
  QLineEdit::QLineEdit(in_stack_ffffffffffffff20,(QWidget *)dp);
  QAbstractSpinBox::setLineEdit(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_02 = &this->edit->super_QWidget;
  Qt::Literals::StringLiterals::operator____L1((char *)dp,(size_t)this_00);
  str.m_data._0_4_ = in_stack_ffffffffffffff28;
  str.m_size = (qsizetype)this_02;
  str.m_data._4_4_ = in_stack_ffffffffffffff2c;
  QAnyStringView::QAnyStringView((QAnyStringView *)dp,str);
  QObject::setObjectName((QAnyStringView *)this_02);
  this_01 = (QSpinBoxValidator *)operator_new(0x20);
  uVar4 = SUB84(this_01,0);
  policy.data = (quint32)((ulong)this_01 >> 0x20);
  QSpinBoxValidator::QSpinBoxValidator(this_01,(QAbstractSpinBox *)this_02,dp);
  this->validator = (QSpinBoxValidator *)CONCAT44(policy.data,uVar4);
  QLineEdit::setValidator
            ((QLineEdit *)this_00,
             (QValidator *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x684bcf);
  (**(code **)(*(long *)pQVar5 + 0x1c0))();
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x2c,&stack0xffffffffffffff98,pQVar5);
  this->spinClickTimerInterval = iVar2;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x53,&stack0xffffffffffffff98,pQVar5,0);
  this->spinClickThresholdTimerInterval = iVar2;
  QWidget::setFocusPolicy(this_00,in_stack_ffffffffffffff0c);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_02,(Policy)((ulong)dp >> 0x20),(Policy)dp,
             (ControlType)((ulong)this_00 >> 0x20));
  QWidget::setSizePolicy(this_02,(QSizePolicy)policy);
  QWidget::setAttribute
            ((QWidget *)this_03,(WidgetAttribute)((ulong)pQVar5 >> 0x20),
             SUB81((ulong)pQVar5 >> 0x18,0));
  QWidget::setAttribute
            ((QWidget *)this_03,(WidgetAttribute)((ulong)pQVar5 >> 0x20),
             SUB81((ulong)pQVar5 >> 0x18,0));
  QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x684cd5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::init()
{
    Q_Q(QAbstractSpinBox);

    q->setLineEdit(new QLineEdit(q));
    edit->setObjectName("qt_spinbox_lineedit"_L1);
    validator = new QSpinBoxValidator(q, this);
    edit->setValidator(validator);

    QStyleOptionSpinBox opt;
    // ### This is called from the ctor and thus we shouldn't call initStyleOption yet
    // ### as we only call the base class implementation of initStyleOption called.
    q->initStyleOption(&opt);
    spinClickTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatRate, &opt, q);
    spinClickThresholdTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatThreshold, &opt, q);
    q->setFocusPolicy(Qt::WheelFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed, QSizePolicy::SpinBox));
    q->setAttribute(Qt::WA_InputMethodEnabled);

    q->setAttribute(Qt::WA_MacShowFocusRect);
}